

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O3

SQRESULT sq_getfunctioninfo(HSQUIRRELVM v,SQInteger level,SQFunctionInfo *fi)

{
  long lVar1;
  SQFunctionProto *pSVar2;
  SQRESULT SVar3;
  char *pcVar4;
  char *pcVar5;
  
  lVar1 = v->_callsstacksize;
  if (level < lVar1) {
    if (v->_callsstack[lVar1 + ~level]._closure.super_SQObject._type == OT_CLOSURE) {
      pSVar2 = (v->_callsstack[lVar1 + ~level]._closure.super_SQObject._unVal.pClosure)->_function;
      fi->funcid = pSVar2;
      pcVar4 = "unknown";
      pcVar5 = "unknown";
      if ((pSVar2->_name).super_SQObject._type == OT_STRING) {
        pcVar5 = (char *)&((pSVar2->_name).super_SQObject._unVal.pTable)->_firstfree;
      }
      fi->name = pcVar5;
      if ((pSVar2->_sourcename).super_SQObject._type == OT_STRING) {
        pcVar4 = (char *)&((pSVar2->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
      }
      fi->source = pcVar4;
      fi->line = pSVar2->_lineinfos->_line;
      return 0;
    }
  }
  SVar3 = sq_throwerror(v,"the object is not a closure");
  return SVar3;
}

Assistant:

SQRESULT sq_getfunctioninfo(HSQUIRRELVM v,SQInteger level,SQFunctionInfo *fi)
{
    SQInteger cssize = v->_callsstacksize;
    if (cssize > level) {
        SQVM::CallInfo &ci = v->_callsstack[cssize-level-1];
        if(sq_isclosure(ci._closure)) {
            SQClosure *c = _closure(ci._closure);
            SQFunctionProto *proto = c->_function;
            fi->funcid = proto;
            fi->name = sq_type(proto->_name) == OT_STRING?_stringval(proto->_name):_SC("unknown");
            fi->source = sq_type(proto->_sourcename) == OT_STRING?_stringval(proto->_sourcename):_SC("unknown");
            fi->line = proto->_lineinfos[0]._line;
            return SQ_OK;
        }
    }
    return sq_throwerror(v,_SC("the object is not a closure"));
}